

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c0_compile_semantic_analysis.cpp
# Opt level: O0

compile_errcode __thiscall Condition::Action(Condition *this)

{
  LogTools *pLVar1;
  bool bVar2;
  allocator local_d9;
  string local_d8;
  allocator local_b1;
  string local_b0;
  allocator local_89;
  string local_88;
  allocator local_51;
  string local_50;
  int local_30;
  int local_2c;
  int character_number;
  int line_number;
  SymbolName name;
  SymbolType expression_type;
  int state;
  int ret;
  Condition *this_local;
  
  expression_type = INT;
  name = WHILE_SYM;
  _state = this;
  do {
    character_number = SymbolQueue::GetCurrentName(handle_correct_queue);
    local_2c = SymbolQueue::GetCurrentLine(handle_correct_queue);
    local_30 = SymbolQueue::GetCurrentCharacter(handle_correct_queue);
    switch(name) {
    case WHILE_SYM:
      expression_type = Expression::Action(&this->m_expression,(SymbolType *)&line_number);
      pLVar1 = g_log_tools;
      if (expression_type != INT) {
        return -1;
      }
      if (line_number == 1) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_50,"condition must be int",&local_51);
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_88,"",&local_89);
        LogTools::SemanticErrorLogs(pLVar1,&local_50,&local_88,local_2c,local_30);
        std::__cxx11::string::~string((string *)&local_88);
        std::allocator<char>::~allocator((allocator<char> *)&local_89);
        std::__cxx11::string::~string((string *)&local_50);
        std::allocator<char>::~allocator((allocator<char> *)&local_51);
      }
      Expression::LogOutput(&this->m_expression);
      name = SWITCH_SYM;
      break;
    case SWITCH_SYM:
      bVar2 = IsRelationalOpeartor(character_number);
      if (!bVar2) {
        return 0;
      }
      name = IF_SYM;
      break;
    case IF_SYM:
      expression_type = Expression::Action(&this->m_expression,(SymbolType *)&line_number);
      pLVar1 = g_log_tools;
      if (expression_type != INT) {
        return -1;
      }
      if (line_number == 1) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_b0,"condition must be int",&local_b1);
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_d8,"",&local_d9);
        LogTools::SemanticErrorLogs(pLVar1,&local_b0,&local_d8,local_2c,local_30);
        std::__cxx11::string::~string((string *)&local_d8);
        std::allocator<char>::~allocator((allocator<char> *)&local_d9);
        std::__cxx11::string::~string((string *)&local_b0);
        std::allocator<char>::~allocator((allocator<char> *)&local_b1);
      }
      Expression::LogOutput(&this->m_expression);
      name = CASE_SYM;
      break;
    case CASE_SYM:
      return 0;
    }
    if (name == IF_SYM) {
      SymbolQueue::NextSymbol(handle_correct_queue);
    }
  } while( true );
}

Assistant:

compile_errcode Condition::Action() {
    int ret = COMPILE_OK;
    int state = 0;
    SymbolType expression_type;
    while (true) {
        SymbolName name = handle_correct_queue->GetCurrentName();
        int line_number = handle_correct_queue->GetCurrentLine();
        int character_number = handle_correct_queue->GetCurrentCharacter();
        switch (state) {
            case 0: {
                if ((ret = m_expression.Action(expression_type)) == COMPILE_OK) {
                    if (expression_type == CHAR) {
                        g_log_tools->SemanticErrorLogs("condition must be int", string(""), line_number, character_number);
                    }
                    m_expression.LogOutput();
                    state = 1;
                    break;
                } else {
                    return NOT_MATCH;
                }
            }
            case 1: {
                if (IsRelationalOpeartor(name)) {
                    state = 2;
                    break;
                } else {
                    return COMPILE_OK;
                }
            }
            case 2: {
                if ((ret = m_expression.Action(expression_type)) == COMPILE_OK) {
                    if (expression_type == CHAR) {
                        g_log_tools->SemanticErrorLogs("condition must be int", string(""), line_number, character_number);
                    }
                    m_expression.LogOutput();
                    state = 3;
                    break;
                } else {
                    return NOT_MATCH;
                }
            }
            case 3: return COMPILE_OK;
        }
        if (state == 2)
            handle_correct_queue->NextSymbol();
    }
}